

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLCache.c
# Opt level: O0

void cuddLocalCacheQuit(DdLocalCache *cache)

{
  DdLocalCache *cache_local;
  
  cache->manager->memused =
       cache->manager->memused - ((ulong)(cache->slots * cache->itemsize) + 0x48);
  cuddLocalCacheRemoveFromList(cache);
  if (cache->item != (DdLocalCacheItem *)0x0) {
    free(cache->item);
    cache->item = (DdLocalCacheItem *)0x0;
  }
  if (cache != (DdLocalCache *)0x0) {
    free(cache);
  }
  return;
}

Assistant:

void
cuddLocalCacheQuit(
  DdLocalCache * cache /* cache to be shut down */)
{
    cache->manager->memused -=
        cache->slots * cache->itemsize + sizeof(DdLocalCache);
    cuddLocalCacheRemoveFromList(cache);
    ABC_FREE(cache->item);
    ABC_FREE(cache);

    return;

}